

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::computeDualActivity
          (SPxLPBase<double> *this,VectorBase<double> *dual,VectorBase<double> *activity,
          bool unscaled)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  Nonzero<double> *pNVar7;
  undefined4 uVar8;
  undefined8 *puVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  long lVar12;
  long lVar13;
  Item *pIVar14;
  int *piVar15;
  iterator __end0;
  ulong uVar16;
  vector<double,_std::allocator<double>_> *__range2;
  bool bVar17;
  DSVectorBase<double> tmp;
  undefined **local_68;
  Nonzero<double> *local_60;
  undefined8 uStack_58;
  Nonzero<double> *local_50;
  undefined4 local_44;
  ulong local_40;
  undefined **local_38;
  
  pdVar4 = (dual->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (uVar10 != (uint)((ulong)((long)(dual->val).super__Vector_base<double,_std::allocator<double>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar4) >> 3
                      )) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_68 = (undefined **)&uStack_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "XSPXLP02 Dual vector for computing dual activity has wrong dimension","");
    *puVar9 = &PTR__SPxException_003af870;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_68,(long)local_60 + (long)local_68);
    *puVar9 = &PTR__SPxException_003b0638;
    __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  pdVar5 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar11 = (long)pdVar6 - (long)pdVar5;
  uVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (uVar2 != (uint)(uVar11 >> 3)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_68 = (undefined **)&uStack_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "XSPXLP04 Activity vector computing dual activity has wrong dimension","");
    *puVar9 = &PTR__SPxException_003af870;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_68,(long)local_60 + (long)local_68);
    *puVar9 = &PTR__SPxException_003b0638;
    __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  bVar17 = 0 < (int)uVar10;
  if (0 < (int)uVar10) {
    uVar16 = 1;
    if ((*pdVar4 != 0.0) || (NAN(*pdVar4))) {
      local_40 = 0;
    }
    else {
      do {
        local_40 = uVar16;
        if (uVar10 == local_40) goto LAB_001d5a78;
        uVar16 = local_40 + 1;
      } while ((pdVar4[local_40] == 0.0) && (!NAN(pdVar4[local_40])));
      bVar17 = local_40 < uVar10;
    }
    if (bVar17) {
      local_60 = (Nonzero<double> *)0x0;
      uStack_58 = (undefined *)0x0;
      local_38 = &PTR__DSVectorBase_003b0660;
      local_68 = &PTR__DSVectorBase_003b0660;
      local_50 = (Nonzero<double> *)0x0;
      local_44 = (undefined4)CONCAT71(in_register_00000009,unscaled);
      uVar10 = 2;
      if (0 < (int)uVar2) {
        uVar10 = uVar2;
      }
      spx_alloc<soplex::Nonzero<double>*>(&local_50,uVar10);
      local_60 = local_50;
      uStack_58 = (undefined *)(ulong)uVar10;
      if (((char)local_44 == '\0') || (this->_isScaled != true)) {
        pIVar14 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                  [local_40 & 0xffffffff].idx;
        pdVar5 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar5 != pdVar6) {
          memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
        }
        lVar12 = (long)(pIVar14->data).super_SVectorBase<double>.memused;
        if (0 < lVar12) {
          pNVar7 = (pIVar14->data).super_SVectorBase<double>.m_elem;
          lVar13 = 0;
          do {
            pdVar5[*(int *)((long)&pNVar7->idx + lVar13)] = *(double *)((long)&pNVar7->val + lVar13)
            ;
            lVar13 = lVar13 + 0x10;
          } while (lVar12 * 0x10 != lVar13);
        }
      }
      else {
        (*this->lp_scaler->_vptr_SPxScaler[0x1a])(this->lp_scaler,this,local_40,&local_68);
        pdVar5 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar5 != pdVar6) {
          memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
        }
        if (0 < (long)uStack_58._4_4_) {
          lVar12 = 0;
          do {
            pdVar5[*(int *)((long)&local_60->idx + lVar12)] =
                 *(double *)((long)&local_60->val + lVar12);
            lVar12 = lVar12 + 0x10;
          } while ((long)uStack_58._4_4_ * 0x10 != lVar12);
        }
      }
      uVar8 = local_44;
      pdVar5 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (uint)((ulong)((long)(activity->val).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar5) >> 3);
      if (0 < (int)uVar10) {
        pdVar6 = (dual->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0;
        do {
          pdVar5[uVar11] = pdVar6[local_40 & 0xffffffff] * pdVar5[uVar11];
          uVar11 = uVar11 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar11);
      }
      if ((int)local_40 + 1 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum)
      {
        do {
          pdVar5 = (dual->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar1 = pdVar5[uVar16];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            if (((char)uVar8 == '\0') || (this->_isScaled != true)) {
              pIVar14 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
              iVar3 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[uVar16].
                      idx;
              lVar12 = (long)pIVar14[iVar3].data.super_SVectorBase<double>.memused;
              if (0 < lVar12) {
                pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                lVar13 = lVar12 + 1;
                piVar15 = &pIVar14[iVar3].data.super_SVectorBase<double>.m_elem[lVar12 + -1].idx;
                do {
                  pdVar6[*piVar15] =
                       pdVar5[uVar16] * ((Nonzero<double> *)(piVar15 + -2))->val + pdVar6[*piVar15];
                  lVar13 = lVar13 + -1;
                  piVar15 = piVar15 + -4;
                } while (1 < lVar13);
              }
            }
            else {
              (*this->lp_scaler->_vptr_SPxScaler[0x1a])
                        (this->lp_scaler,this,uVar16 & 0xffffffff,&local_68);
              lVar12 = (long)uStack_58._4_4_;
              if (0 < lVar12) {
                pdVar5 = (dual->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                lVar13 = lVar12 + 1;
                piVar15 = &local_60[lVar12 + -1].idx;
                do {
                  pdVar6[*piVar15] =
                       pdVar5[uVar16] * ((Nonzero<double> *)(piVar15 + -2))->val + pdVar6[*piVar15];
                  lVar13 = lVar13 + -1;
                  piVar15 = piVar15 + -4;
                } while (1 < lVar13);
              }
            }
          }
          uVar16 = uVar16 + 1;
        } while ((int)uVar16 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum
                );
      }
      local_68 = local_38;
      if (local_50 == (Nonzero<double> *)0x0) {
        return;
      }
      free(local_50);
      return;
    }
  }
LAB_001d5a78:
  if (pdVar5 == pdVar6) {
    return;
  }
  memset(pdVar5,0,(uVar11 - 8 & 0xfffffffffffffff8) + 8);
  return;
}

Assistant:

inline
void SPxLPBase<R>::computeDualActivity(const VectorBase<R>& dual, VectorBase<R>& activity,
                                       const bool unscaled) const
{
   if(dual.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP02 Dual vector for computing dual activity has wrong dimension");

   if(activity.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP04 Activity vector computing dual activity has wrong dimension");

   int r;

   for(r = 0; r < nRows() && dual[r] == 0; r++)
      ;

   if(r >= nRows())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nCols());

   if(unscaled && _isScaled)
   {
      lp_scaler->getRowUnscaled(*this, r, tmp);
      activity = tmp;
   }
   else
      activity = rowVector(r);

   activity *= dual[r];
   r++;

   for(; r < nRows(); r++)
   {
      if(dual[r] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getRowUnscaled(*this, r, tmp);
            activity.multAdd(dual[r], tmp);
         }
         else
            activity.multAdd(dual[r], rowVector(r));
      }
   }
}